

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.h
# Opt level: O1

IKCPCB * __thiscall
sznet::CheckNotNull<IKCPCB>(sznet *this,SourceFile file,int line,char *names,IKCPCB *ptr)

{
  undefined4 in_register_0000000c;
  SourceFile file_00;
  Logger local_fe8;
  
  if (names == (char *)0x0) {
    file_00._8_8_ = (ulong)file.m_data & 0xffffffff;
    file_00.m_data = (char *)this;
    Logger::Logger(&local_fe8,file_00,file.m_size,FATAL);
    LogStream::operator<<(&local_fe8.m_impl.m_stream,(char *)CONCAT44(in_register_0000000c,line));
    Logger::~Logger(&local_fe8);
  }
  return (IKCPCB *)names;
}

Assistant:

T* CheckNotNull(Logger::SourceFile file, int line, const char* names, T* ptr)
{
	if (ptr == nullptr)
	{
		Logger(file, line, Logger::FATAL).stream() << names;
	}
	return ptr;
}